

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertySpecification.cpp
# Opt level: O1

String * __thiscall
Rml::PropertySpecification::PropertiesToString_abi_cxx11_
          (String *__return_storage_ptr__,PropertySpecification *this,PropertyDictionary *dictionary
          ,bool include_name,char delimiter)

{
  NodePtr pDVar1;
  Node *pNVar2;
  PropertyIdNameMap *pPVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  String *pSVar7;
  pointer pPVar8;
  Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
  *pTVar9;
  ulong *puVar10;
  uint uVar11;
  ulong uVar12;
  size_t sVar13;
  long *plVar14;
  undefined7 in_register_00000009;
  long *plVar15;
  pointer pPVar16;
  uint8_t *puVar17;
  ulong *puVar18;
  pair<Rml::PropertyId,_Rml::Property> *pair;
  NodePtr pDVar19;
  const_iterator cVar20;
  PropertyId id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Vector<PropertyId> ids;
  PropertyMap *__range1;
  PropertyId local_c1;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  String *local_a0;
  vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_> local_98;
  int local_78;
  undefined4 local_74;
  Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  PropertySpecification *local_60;
  PropertyId *local_58;
  String local_50;
  
  local_74 = (undefined4)CONCAT71(in_register_00000009,include_name);
  local_60 = this;
  local_70 = PropertyDictionary::GetProperties(dictionary);
  local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
  super__Vector_impl_data._M_start = (PropertyId *)0x0;
  local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
  super__Vector_impl_data._M_finish = (PropertyId *)0x0;
  local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (PropertyId *)0x0;
  ::std::vector<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>::reserve
            (&local_98,local_70->mNumElements);
  pTVar9 = local_70;
  cVar20 = robin_hood::detail::
           Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
           ::cbegin(local_70);
  pDVar1 = (NodePtr)pTVar9->mInfo;
  if (cVar20.mKeyVals != pDVar1) {
    do {
      puVar17 = cVar20.mInfo;
      pDVar19 = cVar20.mKeyVals;
      if (local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<Rml::PropertyId,std::allocator<Rml::PropertyId>>::
        _M_realloc_insert<Rml::PropertyId_const&>
                  ((vector<Rml::PropertyId,std::allocator<Rml::PropertyId>> *)&local_98,
                   (iterator)
                   local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>.
                   _M_impl.super__Vector_impl_data._M_finish,(PropertyId *)pDVar19);
      }
      else {
        *local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
         super__Vector_impl_data._M_finish = (pDVar19->mData).first;
        local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      pDVar19 = pDVar19 + 1;
      uVar12 = *(ulong *)(puVar17 + 1);
      if (uVar12 == 0) {
        puVar10 = (ulong *)(puVar17 + 9);
        do {
          puVar18 = puVar10;
          pDVar19 = pDVar19 + 8;
          uVar12 = *puVar18;
          puVar10 = puVar18 + 1;
        } while (uVar12 == 0);
      }
      else {
        puVar18 = (ulong *)(puVar17 + 1);
      }
      uVar5 = 0;
      if (uVar12 != 0) {
        for (; (uVar12 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      uVar12 = uVar5 >> 3 & 0x1fffffff;
      cVar20.mInfo = (uint8_t *)((long)puVar18 + uVar12);
      cVar20.mKeyVals = pDVar19 + uVar12;
    } while (pDVar19 + uVar12 != pDVar1);
  }
  pPVar8 = local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pPVar16 = local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar6 = 0x3f;
    if ((long)local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl
              .super__Vector_impl_data._M_finish -
        (long)local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl
              .super__Vector_impl_data._M_start != 0) {
      for (; (ulong)((long)local_98.
                           super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)local_98.
                          super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> lVar6 == 0;
          lVar6 = lVar6 + -1) {
      }
    }
    ::std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Rml::PropertyId*,std::vector<Rml::PropertyId,std::allocator<Rml::PropertyId>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>.
               _M_impl.super__Vector_impl_data._M_finish,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    ::std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<Rml::PropertyId*,std::vector<Rml::PropertyId,std::allocator<Rml::PropertyId>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (pPVar16,pPVar8);
  }
  local_68 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_68;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_58 = local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_a0 = __return_storage_ptr__;
  if (local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_78 = (int)delimiter;
    pPVar16 = local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl
              .super__Vector_impl_data._M_start;
    do {
      pTVar9 = local_70;
      local_c1 = *pPVar16;
      sVar13 = robin_hood::detail::
               Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
               ::findIdx<Rml::PropertyId>(local_70,&local_c1);
      pNVar2 = pTVar9->mKeyVals;
      if ((char)local_74 != '\0') {
        pPVar3 = (local_60->property_map)._M_t.
                 super___uniq_ptr_impl<Rml::PropertyIdNameMap,_std::default_delete<Rml::PropertyIdNameMap>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Rml::PropertyIdNameMap_*,_std::default_delete<Rml::PropertyIdNameMap>_>
                 .super__Head_base<0UL,_Rml::PropertyIdNameMap_*,_false>._M_head_impl;
        uVar11 = (uint)local_c1;
        lVar6 = *(long *)&(pPVar3->super_IdNameMap<Rml::PropertyId>).name_map;
        if ((ulong)((long)*(pointer *)
                           ((long)&(pPVar3->super_IdNameMap<Rml::PropertyId>).name_map + 8) - lVar6
                   >> 5) <= (ulong)local_c1) {
          uVar11 = 0;
        }
        lVar4 = *(long *)(lVar6 + (ulong)(uVar11 << 5));
        local_c0 = &local_b0;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c0,lVar4,*(long *)(lVar6 + 8 + (ulong)(uVar11 << 5)) + lVar4);
        ::std::__cxx11::string::append((char *)&local_c0);
        ::std::__cxx11::string::_M_append((char *)local_a0,(ulong)local_c0);
        if (local_c0 != &local_b0) {
          operator_delete(local_c0,local_b0 + 1);
        }
      }
      Property::ToString_abi_cxx11_(&local_50,&pNVar2[sVar13].mData.second);
      plVar14 = (long *)::std::__cxx11::string::_M_replace_aux
                                  ((ulong)&local_50,local_50._M_string_length,0,'\x01');
      plVar15 = plVar14 + 2;
      if ((long *)*plVar14 == plVar15) {
        local_b0 = *plVar15;
        lStack_a8 = plVar14[3];
        local_c0 = &local_b0;
      }
      else {
        local_b0 = *plVar15;
        local_c0 = (long *)*plVar14;
      }
      local_b8 = plVar14[1];
      *plVar14 = (long)plVar15;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)local_a0,(ulong)local_c0);
      if (local_c0 != &local_b0) {
        operator_delete(local_c0,local_b0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pPVar16 = pPVar16 + 1;
    } while (pPVar16 != local_58);
  }
  pSVar7 = local_a0;
  if (local_a0->_M_string_length != 0) {
    ::std::__cxx11::string::pop_back();
  }
  if (local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>._M_impl.
      super__Vector_impl_data._M_start != (PropertyId *)0x0) {
    operator_delete(local_98.super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.
                          super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.
                          super__Vector_base<Rml::PropertyId,_std::allocator<Rml::PropertyId>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return pSVar7;
}

Assistant:

String PropertySpecification::PropertiesToString(const PropertyDictionary& dictionary, bool include_name, char delimiter) const
{
	const PropertyMap& properties = dictionary.GetProperties();

	// For determinism we print the strings in order of increasing property ids.
	Vector<PropertyId> ids;
	ids.reserve(properties.size());
	for (auto& pair : properties)
		ids.push_back(pair.first);

	std::sort(ids.begin(), ids.end());

	String result;
	for (PropertyId id : ids)
	{
		const Property& p = properties.find(id)->second;
		if (include_name)
			result += property_map->GetName(id) + ": ";
		result += p.ToString() + delimiter;
	}

	if (!result.empty())
		result.pop_back();

	return result;
}